

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

bool kratos::has_port_type(Var *var,PortType type)

{
  VarType VVar1;
  bool bVar2;
  byte bVar3;
  Port *p;
  
  bVar3 = 1;
  while (VVar1 = var->type_, VVar1 == Expression) {
    bVar2 = has_port_type((Var *)var[1].super_IRNode.fn_name_ln.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,type);
    var = (Var *)var[1].super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (var == (Var *)0x0) goto LAB_001ece93;
    bVar3 = bVar3 & bVar2;
  }
  if (VVar1 == PortIO) {
    bVar2 = *(PortType *)((long)&var[1].super_IRNode._vptr_IRNode + 4) == type;
    goto LAB_001ece93;
  }
  if (VVar1 == BaseCasted) {
    if (type == ClockEnable) {
      bVar2 = *(int *)&var[1].super_IRNode.fn_name_ln.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish == 4;
      goto LAB_001ece93;
    }
    if (type == AsyncReset) {
      bVar2 = *(int *)&var[1].super_IRNode.fn_name_ln.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish == 3;
      goto LAB_001ece93;
    }
  }
  bVar2 = false;
LAB_001ece93:
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool static has_port_type(Var* var, PortType type) {
    if (var->type() == VarType::Expression) {
        auto* expr = reinterpret_cast<Expr*>(var);
        auto l = has_port_type(expr->left, type);
        if (expr->right) {
            auto r = has_port_type(expr->right, type);
            return l && r;
        }
        return l;
    }
    if (var->type() == VarType::PortIO) {
        auto* p = reinterpret_cast<Port*>(var);
        return p->port_type() == type;
    } else if (var->type() == VarType::BaseCasted) {
        auto* casted = reinterpret_cast<VarCasted*>(var);
        if (type == PortType::AsyncReset)
            return casted->cast_type() == VarCastType::AsyncReset;
        else if (type == PortType::ClockEnable)
            return casted->cast_type() == VarCastType::ClockEnable;
        else if (type == PortType::Clock)
            return casted->cast_type() == VarCastType::Clock;
    }
    return false;
}